

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::processAuthority(XMLCh *authSpec,XMLSize_t authLen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  XMLCh *toSearch;
  XMLSize_t hostLen;
  XMLCh *local_38;
  
  iVar2 = XMLString::indexOf(authSpec,L'@');
  if ((ulong)(long)iVar2 < authLen) {
    uVar7 = (ulong)(iVar2 + 1);
    local_38 = authSpec;
  }
  else {
    uVar7 = 0;
    local_38 = L"";
    iVar2 = 0;
  }
  toSearch = authSpec + uVar7;
  hostLen = authLen - uVar7;
  if ((authLen < uVar7 || hostLen == 0) || (authSpec[uVar7] != L'[')) {
    iVar3 = XMLString::indexOf(toSearch,L':');
    if (iVar3 == -1) {
      iVar4 = -1;
    }
    else {
      iVar4 = -1;
      if ((ulong)(long)iVar3 < authLen) {
        iVar4 = iVar3;
      }
    }
  }
  else {
    iVar3 = XMLString::indexOf(authSpec + uVar7,L']');
    iVar4 = -1;
    if ((iVar3 != -1) && (iVar4 = iVar3, (ulong)(long)iVar3 < authLen)) {
      uVar6 = (long)iVar3 + uVar7 + 1;
      iVar4 = -1;
      if (uVar6 < authLen) {
        iVar4 = -1;
        if (authSpec[uVar6] == L':') {
          iVar4 = iVar3 + 1;
        }
      }
    }
  }
  uVar6 = authLen;
  if (iVar4 != -1) {
    hostLen = (XMLSize_t)iVar4;
    uVar6 = hostLen + uVar7 + 1;
  }
  iVar5 = -1;
  iVar3 = iVar5;
  if (((uVar6 < authLen && iVar4 != -1) && hostLen != 0) && (authSpec[uVar6] != L'\0')) {
    if (uVar6 == authLen) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        if ((ushort)(authSpec[uVar6] + L'ￆ') < 0xfff6) {
          toSearch = L"";
          hostLen = 0;
          local_38 = L"";
          iVar2 = 0;
          iVar3 = iVar5;
          break;
        }
        iVar3 = (uint)(ushort)authSpec[uVar6] + iVar3 * 10 + -0x30;
        uVar6 = uVar6 + 1;
      } while (authLen != uVar6);
    }
  }
  bVar1 = isValidServerBasedAuthority(toSearch,hostLen,iVar3,local_38,(long)iVar2);
  if (!bVar1) {
    bVar1 = isValidRegistryBasedAuthority(authSpec,authLen);
    return bVar1;
  }
  return true;
}

Assistant:

bool XMLUri::processAuthority( const XMLCh* const authSpec
                             , const XMLSize_t authLen)
{
    int index = XMLString::indexOf(authSpec, chAt);
    XMLSize_t start = 0;

    // server = [ [ userinfo "@" ] hostport ]
    // userinfo is everything up @,
    const XMLCh* userinfo;
    int userInfoLen = 0;
    if ((index != -1) && (XMLSize_t(index) < authLen))
    {
        userinfo = authSpec;
        userInfoLen = index;
        start = index + 1;
    }
    else
    {
        userinfo = XMLUni::fgZeroLenString;
    }

    // hostport = host [ ":" port ]
    // host is everything up to ':', or up to
    // and including ']' if followed by ':'.
    //
    // Search for port boundary.
    const XMLCh* host;
    XMLSize_t hostLen = 0;
    if ((start < authLen) && (authSpec[start] == chOpenSquare))
    {
    	index = XMLString::indexOf(&(authSpec[start]), chCloseSquare);
    	if ((index != -1) && (XMLSize_t(index) < authLen))
    	{
            // skip the ']'
            index = ((start + index + 1) < authLen
              && authSpec[start + index + 1] == chColon) ? index+1 : -1;
    	}
    }
    else
    {
        index = XMLString::indexOf(&(authSpec[start]), chColon);
        if (index!=-1 && XMLSize_t(index) >= authLen)
            index = -1;
    }

    host = &(authSpec[start]);
    if (index != -1)
    {
        hostLen = index;
        start += index + 1;  // skip the :
    }
    else
    {
        hostLen = authLen - start;
        start = authLen;
    }

    // port is everything after ":"
    int port = -1;
    if ((hostLen) &&   // non empty host
        (index != -1)                    &&   // ":" found
        (start < authLen)                     )   // ":" is not the last
    {
        const XMLCh* portStr = &(authSpec[start]);
        if (*portStr)
        {
            port = 0;
            for (XMLSize_t i=0; i<(authLen - start); i++)
            {
                if (portStr[i] < chDigit_0 || portStr[i] > chDigit_9)
                {
                  // Assume this is a registry-based authority.
                  //
                  port = -1;
                  hostLen = 0;
                  host = XMLUni::fgZeroLenString;
                  userInfoLen = 0;
                  userinfo = XMLUni::fgZeroLenString;
                  break;
                }

                port = (port * 10) + (int) (portStr[i] - chDigit_0);
            }
        }
    }

    return isValidServerBasedAuthority(host, hostLen, port, userinfo, userInfoLen)
      || isValidRegistryBasedAuthority(authSpec, authLen);
}